

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Literal * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::ExternalInterface::load
          (Literal *__return_storage_ptr__,ExternalInterface *this,Load *load,Address addr,
          Name memory)

{
  uint8_t uVar1;
  BasicType BVar2;
  uint uVar3;
  uint32_t init;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  pointer init_00;
  array<unsigned_char,_16UL> local_218;
  undefined4 local_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  char *local_1f8;
  Literal local_1f0;
  undefined4 local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  char *local_1c8;
  Literal local_1c0;
  undefined4 local_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  char *local_180;
  float local_174;
  Literal local_170;
  ExternalInterface *local_158;
  size_t local_150;
  char *local_148;
  ExternalInterface *local_140;
  size_t local_138;
  char *local_130;
  ExternalInterface *local_128;
  size_t local_120;
  char *local_118;
  ExternalInterface *local_110;
  size_t local_108;
  char *local_100;
  ExternalInterface *local_f8;
  size_t local_f0;
  char *local_e8;
  ExternalInterface *local_e0;
  size_t local_d8;
  char *local_d0;
  ExternalInterface *local_c8;
  size_t local_c0;
  char *local_b8;
  ExternalInterface *local_b0;
  size_t local_a8;
  char *local_a0;
  ExternalInterface *local_98;
  size_t local_90;
  char *local_88;
  ExternalInterface *local_80;
  size_t local_78;
  char *local_70;
  ExternalInterface *local_68;
  size_t local_60;
  char *local_58;
  ExternalInterface *local_50;
  size_t local_48;
  char *local_40;
  Load *local_38;
  Load *load_local;
  ExternalInterface *this_local;
  Name memory_local;
  Address addr_local;
  
  memory_local.super_IString.str._M_len = memory.super_IString.str._M_str;
  this_local = memory.super_IString.str._M_len;
  local_38 = load;
  load_local = (Load *)this;
  memory_local.super_IString.str._M_str = (char *)addr.addr;
  BVar2 = wasm::Type::getBasic
                    (&(load->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.
                      type);
  switch(BVar2) {
  case none:
  case unreachable:
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                       ,0xb13);
  case i32:
    uVar1 = local_38->bytes;
    if (uVar1 == '\x01') {
      if ((local_38->signed_ & 1U) == 0) {
        local_58 = memory_local.super_IString.str._M_str;
        local_68 = this_local;
        local_60 = memory_local.super_IString.str._M_len;
        uVar3 = (*this->_vptr_ExternalInterface[0xe])
                          (this,memory_local.super_IString.str._M_str,this_local,
                           memory_local.super_IString.str._M_len);
        wasm::Literal::Literal(__return_storage_ptr__,uVar3 & 0xff);
      }
      else {
        local_40 = memory_local.super_IString.str._M_str;
        local_50 = this_local;
        local_48 = memory_local.super_IString.str._M_len;
        iVar4 = (*this->_vptr_ExternalInterface[0xd])
                          (this,memory_local.super_IString.str._M_str,this_local,
                           memory_local.super_IString.str._M_len);
        wasm::Literal::Literal(__return_storage_ptr__,(int)(char)iVar4);
      }
    }
    else if (uVar1 == '\x02') {
      if ((local_38->signed_ & 1U) == 0) {
        local_88 = memory_local.super_IString.str._M_str;
        local_98 = this_local;
        local_90 = memory_local.super_IString.str._M_len;
        uVar3 = (*this->_vptr_ExternalInterface[0x10])
                          (this,memory_local.super_IString.str._M_str,this_local,
                           memory_local.super_IString.str._M_len);
        wasm::Literal::Literal(__return_storage_ptr__,uVar3 & 0xffff);
      }
      else {
        local_70 = memory_local.super_IString.str._M_str;
        local_80 = this_local;
        local_78 = memory_local.super_IString.str._M_len;
        iVar4 = (*this->_vptr_ExternalInterface[0xf])
                          (this,memory_local.super_IString.str._M_str,this_local,
                           memory_local.super_IString.str._M_len);
        wasm::Literal::Literal(__return_storage_ptr__,(int)(short)iVar4);
      }
    }
    else {
      if (uVar1 != '\x04') {
        handle_unreachable("invalid size",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                           ,0xae7);
      }
      local_a0 = memory_local.super_IString.str._M_str;
      local_b0 = this_local;
      local_a8 = memory_local.super_IString.str._M_len;
      iVar4 = (*this->_vptr_ExternalInterface[0x11])
                        (this,memory_local.super_IString.str._M_str,this_local,
                         memory_local.super_IString.str._M_len);
      wasm::Literal::Literal(__return_storage_ptr__,iVar4);
    }
    break;
  case i64:
    switch(local_38->bytes) {
    case '\x01':
      if ((local_38->signed_ & 1U) == 0) {
        local_d0 = memory_local.super_IString.str._M_str;
        local_e0 = this_local;
        local_d8 = memory_local.super_IString.str._M_len;
        uVar3 = (*this->_vptr_ExternalInterface[0xe])
                          (this,memory_local.super_IString.str._M_str,this_local,
                           memory_local.super_IString.str._M_len);
        wasm::Literal::Literal(__return_storage_ptr__,(ulong)(uVar3 & 0xff));
      }
      else {
        local_b8 = memory_local.super_IString.str._M_str;
        local_c8 = this_local;
        local_c0 = memory_local.super_IString.str._M_len;
        iVar4 = (*this->_vptr_ExternalInterface[0xd])
                          (this,memory_local.super_IString.str._M_str,this_local,
                           memory_local.super_IString.str._M_len);
        wasm::Literal::Literal(__return_storage_ptr__,(long)(char)iVar4);
      }
      break;
    case '\x02':
      if ((local_38->signed_ & 1U) == 0) {
        local_100 = memory_local.super_IString.str._M_str;
        local_110 = this_local;
        local_108 = memory_local.super_IString.str._M_len;
        uVar3 = (*this->_vptr_ExternalInterface[0x10])
                          (this,memory_local.super_IString.str._M_str,this_local,
                           memory_local.super_IString.str._M_len);
        wasm::Literal::Literal(__return_storage_ptr__,(ulong)(uVar3 & 0xffff));
      }
      else {
        local_e8 = memory_local.super_IString.str._M_str;
        local_f8 = this_local;
        local_f0 = memory_local.super_IString.str._M_len;
        iVar4 = (*this->_vptr_ExternalInterface[0xf])
                          (this,memory_local.super_IString.str._M_str,this_local,
                           memory_local.super_IString.str._M_len);
        wasm::Literal::Literal(__return_storage_ptr__,(long)(short)iVar4);
      }
      break;
    default:
      handle_unreachable("invalid size",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                         ,0xaf9);
    case '\x04':
      if ((local_38->signed_ & 1U) == 0) {
        local_130 = memory_local.super_IString.str._M_str;
        local_140 = this_local;
        local_138 = memory_local.super_IString.str._M_len;
        uVar3 = (*this->_vptr_ExternalInterface[0x12])
                          (this,memory_local.super_IString.str._M_str,this_local,
                           memory_local.super_IString.str._M_len);
        wasm::Literal::Literal(__return_storage_ptr__,(ulong)uVar3);
      }
      else {
        local_118 = memory_local.super_IString.str._M_str;
        local_128 = this_local;
        local_120 = memory_local.super_IString.str._M_len;
        iVar4 = (*this->_vptr_ExternalInterface[0x11])
                          (this,memory_local.super_IString.str._M_str,this_local,
                           memory_local.super_IString.str._M_len);
        wasm::Literal::Literal(__return_storage_ptr__,(long)iVar4);
      }
      break;
    case '\b':
      local_148 = memory_local.super_IString.str._M_str;
      local_158 = this_local;
      local_150 = memory_local.super_IString.str._M_len;
      iVar4 = (*this->_vptr_ExternalInterface[0x13])
                        (this,memory_local.super_IString.str._M_str,this_local,
                         memory_local.super_IString.str._M_len);
      wasm::Literal::Literal(__return_storage_ptr__,CONCAT44(extraout_var,iVar4));
    }
    break;
  case f32:
    if (local_38->bytes == '\x02') {
      local_180 = memory_local.super_IString.str._M_str;
      local_198 = this_local._0_4_;
      uStack_194 = this_local._4_4_;
      uStack_190 = (undefined4)memory_local.super_IString.str._M_len;
      uStack_18c = memory_local.super_IString.str._M_len._4_4_;
      iVar4 = (*this->_vptr_ExternalInterface[0x10])
                        (this,memory_local.super_IString.str._M_str,this_local,
                         memory_local.super_IString.str._M_len);
      local_174 = fp16_ieee_to_fp32_value((uint16_t)iVar4);
      iVar4 = bit_cast<int,float>(&local_174);
      wasm::Literal::Literal(&local_170,iVar4);
      wasm::Literal::castToF32(__return_storage_ptr__,&local_170);
      wasm::Literal::~Literal(&local_170);
    }
    else {
      if (local_38->bytes != '\x04') {
        handle_unreachable("invalid size",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                           ,0xb09);
      }
      local_1c8 = memory_local.super_IString.str._M_str;
      local_1d8 = this_local._0_4_;
      uStack_1d4 = this_local._4_4_;
      uStack_1d0 = (undefined4)memory_local.super_IString.str._M_len;
      uStack_1cc = memory_local.super_IString.str._M_len._4_4_;
      init = (*this->_vptr_ExternalInterface[0x12])
                       (this,memory_local.super_IString.str._M_str,this_local,
                        memory_local.super_IString.str._M_len);
      wasm::Literal::Literal(&local_1c0,init);
      wasm::Literal::castToF32(__return_storage_ptr__,&local_1c0);
      wasm::Literal::~Literal(&local_1c0);
    }
    break;
  case f64:
    local_1f8 = memory_local.super_IString.str._M_str;
    local_208 = this_local._0_4_;
    uStack_204 = this_local._4_4_;
    uStack_200 = (undefined4)memory_local.super_IString.str._M_len;
    uStack_1fc = memory_local.super_IString.str._M_len._4_4_;
    iVar4 = (*this->_vptr_ExternalInterface[0x14])
                      (this,memory_local.super_IString.str._M_str,this_local,
                       memory_local.super_IString.str._M_len);
    wasm::Literal::Literal(&local_1f0,CONCAT44(extraout_var_00,iVar4));
    wasm::Literal::castToF64(__return_storage_ptr__,&local_1f0);
    wasm::Literal::~Literal(&local_1f0);
    break;
  case v128:
    local_218._M_elems._0_4_ =
         (*this->_vptr_ExternalInterface[0x15])
                   (this,memory_local.super_IString.str._M_str,
                    (local_38->memory).super_IString.str._M_len,
                    (local_38->memory).super_IString.str._M_str);
    local_218._M_elems._4_4_ = extraout_var_01;
    init_00 = std::array<unsigned_char,_16UL>::data(&local_218);
    wasm::Literal::Literal(__return_storage_ptr__,init_00);
    break;
  default:
    handle_unreachable("invalid type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                       ,0xb15);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual Literal load(Load* load, Address addr, Name memory) {
      switch (load->type.getBasic()) {
        case Type::i32: {
          switch (load->bytes) {
            case 1:
              return load->signed_ ? Literal((int32_t)load8s(addr, memory))
                                   : Literal((int32_t)load8u(addr, memory));
            case 2:
              return load->signed_ ? Literal((int32_t)load16s(addr, memory))
                                   : Literal((int32_t)load16u(addr, memory));
            case 4:
              return Literal((int32_t)load32s(addr, memory));
            default:
              WASM_UNREACHABLE("invalid size");
          }
          break;
        }
        case Type::i64: {
          switch (load->bytes) {
            case 1:
              return load->signed_ ? Literal((int64_t)load8s(addr, memory))
                                   : Literal((int64_t)load8u(addr, memory));
            case 2:
              return load->signed_ ? Literal((int64_t)load16s(addr, memory))
                                   : Literal((int64_t)load16u(addr, memory));
            case 4:
              return load->signed_ ? Literal((int64_t)load32s(addr, memory))
                                   : Literal((int64_t)load32u(addr, memory));
            case 8:
              return Literal((int64_t)load64s(addr, memory));
            default:
              WASM_UNREACHABLE("invalid size");
          }
          break;
        }
        case Type::f32: {
          switch (load->bytes) {
            case 2: {
              // Convert the float16 to float32 and store the binary
              // representation.
              return Literal(bit_cast<int32_t>(
                               fp16_ieee_to_fp32_value(load16u(addr, memory))))
                .castToF32();
            }
            case 4:
              return Literal(load32u(addr, memory)).castToF32();
            default:
              WASM_UNREACHABLE("invalid size");
          }
          break;
        }
        case Type::f64:
          return Literal(load64u(addr, memory)).castToF64();
        case Type::v128:
          return Literal(load128(addr, load->memory).data());
        case Type::none:
        case Type::unreachable:
          WASM_UNREACHABLE("unexpected type");
      }
      WASM_UNREACHABLE("invalid type");
    }